

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

void __thiscall
optimization::global_expr_move::Global_Expr_Mov::optimize_func
          (Global_Expr_Mov *this,MirFunction *func)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer ppVar4;
  reference pvVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  pointer pIVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  LabelId *__x;
  ostream *poVar11;
  long in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar12;
  int pre;
  iterator __end4;
  iterator __begin4;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  mapped_type var_2;
  LabelId id_1;
  LoadOp op_1;
  LoadOffsetInst *loadInst;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  find_iter;
  pair<int,_int> point;
  mapped_type *usepoints;
  VarId var_1;
  iterator __end8;
  iterator __begin8;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range8;
  mapped_type var;
  VarId rhs_1;
  VarId lhs_1;
  VarId rhs;
  VarId lhs;
  Op op;
  int id;
  OpInst *opInst;
  Inst *i_1;
  InstKind kind;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator iter_2;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *variables;
  mapped_type *blv;
  mapped_type *block;
  mapped_type *blk_1;
  value_type start;
  iterator iter_1;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  list<int,_std::allocator<int>_> queue;
  Var_Replace vp;
  Livevar_Analyse lva;
  bool modify;
  int cnt;
  RefInst *refinst;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator iter;
  BasicBlk *blk;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  BasicBlk *startblk;
  undefined4 in_stack_fffffffffffff648;
  uint32_t in_stack_fffffffffffff64c;
  undefined4 in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff658;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffff660;
  const_iterator in_stack_fffffffffffff668;
  Op *in_stack_fffffffffffff670;
  Var_Replace *in_stack_fffffffffffff678;
  Livevar_Analyse *in_stack_fffffffffffff680;
  MirFunction *in_stack_fffffffffffff688;
  Var_Replace *in_stack_fffffffffffff690;
  LabelId in_stack_fffffffffffff6a0;
  value_type in_stack_fffffffffffff6a4;
  VarId *in_stack_fffffffffffff6a8;
  undefined8 local_950;
  Timestamp *in_stack_fffffffffffff6d8;
  ostream *in_stack_fffffffffffff6e0;
  ostream *in_stack_fffffffffffff710;
  MirFunction *in_stack_fffffffffffff718;
  Livevar_Analyse *in_stack_fffffffffffff720;
  iterator in_stack_fffffffffffff748;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffff750;
  mapped_type *in_stack_fffffffffffff780;
  mapped_type *in_stack_fffffffffffff788;
  mapped_type *in_stack_fffffffffffff790;
  LabelId in_stack_fffffffffffff7b8;
  value_type in_stack_fffffffffffff7bc;
  Var_Replace *in_stack_fffffffffffff7c0;
  undefined8 local_7f8;
  undefined8 local_780;
  int local_768;
  _Self local_760;
  _Self local_758;
  set<int,_std::less<int>,_std::allocator<int>_> *local_750;
  _Base_ptr local_748;
  undefined1 local_740;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_738;
  uint32_t local_730;
  undefined4 local_72c;
  undefined1 local_728 [24];
  undefined1 local_710 [116];
  LabelId local_69c;
  undefined8 local_628;
  uint32_t local_620;
  undefined4 local_61c;
  Timestamp local_610;
  allocator<char> local_5e9;
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0 [120];
  time_point_sys_clock local_548;
  Timestamp local_540 [3];
  undefined1 local_4f5;
  undefined4 local_4f4;
  size_type local_4d8;
  pair<int,_int> local_4d0;
  iterator in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb44;
  iterator in_stack_fffffffffffffb48;
  difference_type local_490;
  pair<int,_int> local_488;
  mapped_type *local_480;
  _Self local_468;
  _Self local_460;
  undefined1 local_458 [48];
  undefined1 *local_428;
  VarId local_410 [12];
  Var_Replace local_350 [2];
  int local_244;
  undefined8 local_240;
  type local_238;
  int local_22c;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_228;
  reference local_220;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_218;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_210;
  long local_208;
  mapped_type *local_200;
  mapped_type *local_1f8;
  mapped_type *local_1f0;
  value_type local_1e4;
  _Base_ptr local_1e0;
  _Base_ptr local_1d8;
  list<int,_std::allocator<int>_> local_1a0 [11];
  byte local_8d;
  undefined4 local_8c;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_88;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_78;
  undefined8 local_70;
  type local_68;
  reference local_60;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_58;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_50;
  BasicBlk *local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  _Base_ptr local_20;
  BasicBlk *local_18;
  long local_10;
  
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17f4c8);
  if ((peVar3->is_extern & 1U) != 0) {
    return;
  }
  local_20 = (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x17f4f9);
  local_18 = &ppVar4->second;
  local_28 = local_10 + 0x68;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  do {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      local_8c = 0;
      do {
        local_8d = 0;
        livevar_analyse::Livevar_Analyse::Livevar_Analyse
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                   SUB81((ulong)in_stack_fffffffffffff710 >> 0x38,0));
        livevar_analyse::Livevar_Analyse::build(in_stack_fffffffffffff680);
        var_replace::Var_Replace::Var_Replace
                  (in_stack_fffffffffffff7c0,
                   (MirFunction *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
        std::
        make_shared<optimization::global_expr_move::Env,mir::inst::MirFunction&,optimization::livevar_analyse::Livevar_Analyse&,optimization::var_replace::Var_Replace&,bool&>
                  (in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                   (bool *)in_stack_fffffffffffff670);
        std::shared_ptr<optimization::global_expr_move::Env>::operator=
                  ((shared_ptr<optimization::global_expr_move::Env> *)
                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (shared_ptr<optimization::global_expr_move::Env> *)
                   CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        std::shared_ptr<optimization::global_expr_move::Env>::~shared_ptr
                  ((shared_ptr<optimization::global_expr_move::Env> *)0x17f835);
        std::__cxx11::list<int,_std::allocator<int>_>::list
                  ((list<int,_std::allocator<int>_> *)0x17f84a);
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x17f857);
        local_1d8 = (_Base_ptr)
                    std::
                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                           *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        local_1e0 = (_Base_ptr)
                    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                              (in_stack_fffffffffffff658._M_node,in_stack_fffffffffffff654);
        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x17f89c);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffff660._M_current,
                   (value_type_conflict3 *)in_stack_fffffffffffff658._M_node);
LAB_0017f8b0:
        while (bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty(local_1a0),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar5 = std::__cxx11::list<int,_std::allocator<int>_>::front
                             ((list<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
          local_1e4 = *pvVar5;
          std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                    ((list<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
          sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffff660._M_current,
                             (key_type *)in_stack_fffffffffffff658._M_node);
          if (sVar6 == 0) {
            local_1f8 = std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                              *)in_stack_fffffffffffff670,
                             &(in_stack_fffffffffffff668._M_current)->first);
            local_1f0 = local_1f8;
            local_200 = std::
                        map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                        ::operator[]((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                                      *)in_stack_fffffffffffff690,
                                     (key_type *)in_stack_fffffffffffff688);
            local_208 = local_10 + 0x38;
            local_210._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
LAB_0017fa0c:
            do {
              local_218 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          std::
                          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                 (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              if (!bVar1) goto LAB_00180b29;
              local_220 = __gnu_cxx::
                          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          ::operator*(&local_210);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         0x17fa79);
              pmVar7 = std::
                       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                             *)in_stack_fffffffffffff670,
                            (key_type_conflict *)in_stack_fffffffffffff668._M_current);
              if ((pmVar7->is_phi_var & 1U) != 0) {
                local_228 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            __gnu_cxx::
                            __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                          *)in_stack_fffffffffffff658._M_node,
                                         in_stack_fffffffffffff654);
                goto LAB_0017fa0c;
              }
              pIVar8 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                       operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)0x17face);
              local_22c = (*(pIVar8->super_Displayable)._vptr_Displayable[1])();
              local_238 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                          operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                     *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                   );
              if (local_22c == 1) {
                if (local_238 == (type)0x0) {
                  local_7f8 = 0;
                }
                else {
                  local_7f8 = __dynamic_cast(local_238,&mir::inst::Inst::typeinfo,
                                             &mir::inst::OpInst::typeinfo,0);
                }
                local_240 = local_7f8;
                bVar1 = mir::inst::Value::is_immediate((Value *)0x17fb9c);
                if ((!bVar1) || (bVar1 = mir::inst::Value::is_immediate((Value *)0x17fbb3), !bVar1))
                {
                  local_244 = -1;
                  mir::inst::Value::Value
                            ((Value *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                             (Value *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
                  ;
                  mir::inst::Value::Value
                            ((Value *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                             (Value *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
                  ;
                  Op::Op(in_stack_fffffffffffff670,
                         (Op)((ulong)in_stack_fffffffffffff668._M_current >> 0x20),
                         (Value *)in_stack_fffffffffffff660._M_current,
                         (Value *)in_stack_fffffffffffff658._M_node);
                  bVar1 = mir::inst::Value::is_immediate((Value *)0x17fc40);
                  if ((bVar1) || (bVar1 = mir::inst::Value::is_immediate((Value *)0x17fc59), bVar1))
                  {
                    bVar1 = mir::inst::Value::is_immediate((Value *)0x17fdb6);
                    if (bVar1) {
                      bVar1 = mir::inst::Value::is_immediate((Value *)0x17feaa);
                      if (!bVar1) {
                        std::get<mir::inst::VarId,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x17fec3);
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650),
                                   (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                     in_stack_fffffffffffff648));
                        std::
                        __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x17fef7);
                        std::
                        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x17ff03);
                        sVar9 = std::
                                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                         *)in_stack_fffffffffffff660._M_current,
                                        (key_type *)in_stack_fffffffffffff658._M_node);
                        if (sVar9 == 0) goto LAB_00180b0d;
                        std::
                        variant<optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                        ::
                        variant<optimization::global_expr_move::Op&,void,void,optimization::global_expr_move::Op,void>
                                  ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                    *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                   (Op *)CONCAT44(in_stack_fffffffffffff64c,
                                                  in_stack_fffffffffffff648));
                        local_244 = bfs((Global_Expr_Mov *)in_stack_fffffffffffffb48._M_current,
                                        in_stack_fffffffffffffb44,
                                        (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                         *)in_stack_fffffffffffffb38._M_current);
                      }
                    }
                    else {
                      std::get<mir::inst::VarId,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)0x17fdcf);
                      in_stack_fffffffffffff7c0 = local_350;
                      mir::inst::VarId::VarId
                                ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                   in_stack_fffffffffffff650),
                                 (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                   in_stack_fffffffffffff648));
                      std::
                      __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17fe03);
                      std::
                      __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17fe0f);
                      sVar9 = std::
                              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                       *)in_stack_fffffffffffff660._M_current,
                                      (key_type *)in_stack_fffffffffffff658._M_node);
                      if (sVar9 == 0) goto LAB_00180b0d;
                      in_stack_fffffffffffff7bc = local_1e4;
                      std::
                      variant<optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      ::
                      variant<optimization::global_expr_move::Op&,void,void,optimization::global_expr_move::Op,void>
                                ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                  *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                 (Op *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648)
                                );
                      in_stack_fffffffffffff7b8 =
                           bfs((Global_Expr_Mov *)in_stack_fffffffffffffb48._M_current,
                               in_stack_fffffffffffffb44,
                               (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                *)in_stack_fffffffffffffb38._M_current);
                      local_244 = in_stack_fffffffffffff7b8;
                    }
LAB_0017ff8c:
                    if (local_244 != local_1e4) {
                      std::
                      __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17ffad);
                      in_stack_fffffffffffff790 =
                           std::
                           map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                           ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                 *)in_stack_fffffffffffff670,
                                &(in_stack_fffffffffffff668._M_current)->first);
                      in_stack_fffffffffffff788 =
                           std::
                           unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
                           ::at((unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                      mir::inst::VarId::VarId
                                ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                   in_stack_fffffffffffff650),
                                 (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                   in_stack_fffffffffffff648));
                      in_stack_fffffffffffff780 =
                           std::
                           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                           ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                 *)in_stack_fffffffffffff670,
                                (key_type_conflict *)in_stack_fffffffffffff668._M_current);
                      if ((in_stack_fffffffffffff780->is_phi_var & 1U) == 0) {
                        local_4f5 = 0;
                        in_stack_fffffffffffff720 =
                             (Livevar_Analyse *)
                             AixLog::operator<<((ostream *)in_stack_fffffffffffff750._M_current,
                                                (Severity *)in_stack_fffffffffffff748._M_current);
                        AixLog::Tag::Tag((Tag *)0x180478);
                        in_stack_fffffffffffff718 =
                             (MirFunction *)
                             AixLog::operator<<((ostream *)in_stack_fffffffffffff680,
                                                (Tag *)in_stack_fffffffffffff678);
                        local_548.__d.__r = (duration)std::chrono::_V2::system_clock::now();
                        AixLog::Timestamp::Timestamp(local_540,&local_548);
                        in_stack_fffffffffffff710 =
                             AixLog::operator<<(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8)
                        ;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688,
                                   (allocator<char> *)in_stack_fffffffffffff680);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688,
                                   (allocator<char> *)in_stack_fffffffffffff680);
                        AixLog::Function::Function
                                  ((Function *)in_stack_fffffffffffff660._M_current,
                                   (string *)in_stack_fffffffffffff658._M_node,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                   CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                        AixLog::operator<<((ostream *)in_stack_fffffffffffff680,
                                           (Function *)in_stack_fffffffffffff678);
                        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                        operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    *)0x180592);
                        poVar11 = prelude::operator<<((ostream *)
                                                      CONCAT44(in_stack_fffffffffffff654,
                                                               in_stack_fffffffffffff650),
                                                      (Displayable *)
                                                      CONCAT44(in_stack_fffffffffffff64c,
                                                               in_stack_fffffffffffff648));
                        std::operator<<(poVar11," is replaced to ");
                        in_stack_fffffffffffff6e0 =
                             prelude::operator<<((ostream *)
                                                 CONCAT44(in_stack_fffffffffffff654,
                                                          in_stack_fffffffffffff650),
                                                 (Displayable *)
                                                 CONCAT44(in_stack_fffffffffffff64c,
                                                          in_stack_fffffffffffff648));
                        std::ostream::operator<<
                                  (in_stack_fffffffffffff6e0,std::endl<char,std::char_traits<char>>)
                        ;
                        AixLog::Function::~Function
                                  ((Function *)
                                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
                        std::__cxx11::string::~string(local_5e8);
                        std::allocator<char>::~allocator(&local_5e9);
                        std::__cxx11::string::~string(local_5c0);
                        std::allocator<char>::~allocator(&local_5c1);
                        AixLog::Timestamp::~Timestamp(local_540);
                        AixLog::Tag::~Tag((Tag *)0x18065e);
                        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                        operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    *)0x18066b);
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650),
                                   (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                     in_stack_fffffffffffff648));
                        in_stack_fffffffffffff6d8 = &local_610;
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650),
                                   (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                     in_stack_fffffffffffff648));
                        var_replace::Var_Replace::replace
                                  ((Var_Replace *)in_stack_fffffffffffff790,
                                   in_stack_fffffffffffff788,(VarId *)in_stack_fffffffffffff780);
                        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                        operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    *)0x1806d0);
                        local_61c = 0xfffffc19;
                        std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int>
                                  (in_stack_fffffffffffff6a8,
                                   (int *)CONCAT44(in_stack_fffffffffffff6a4,
                                                   in_stack_fffffffffffff6a0));
                        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                        operator=((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)in_stack_fffffffffffff660._M_current,
                                  (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                   *)in_stack_fffffffffffff658._M_node);
                        std::
                        unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                       *)CONCAT44(in_stack_fffffffffffff654,
                                                  in_stack_fffffffffffff650));
                      }
                      else {
                        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                        operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    *)0x180041);
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650),
                                   (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                     in_stack_fffffffffffff648));
                        pmVar10 = std::
                                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                  ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                        *)in_stack_fffffffffffff670,
                                       &(in_stack_fffffffffffff668._M_current)->first);
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::size(&pmVar10->inst);
                        var_replace::Var_Replace::setdefpoint
                                  (in_stack_fffffffffffff690,(VarId *)in_stack_fffffffffffff688,
                                   (LabelId)((ulong)in_stack_fffffffffffff680 >> 0x20),
                                   (int)in_stack_fffffffffffff680);
                        pIVar8 = std::
                                 unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 ::operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                               *)0x1800c4);
                        (*(pIVar8->super_Displayable)._vptr_Displayable[2])(local_458);
                        local_428 = local_458;
                        local_460._M_node =
                             (_Base_ptr)
                             std::
                             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                      *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648
                                                ));
                        local_468._M_node =
                             (_Base_ptr)
                             std::
                             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                    *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
                        ;
                        while (bVar1 = std::operator!=(&local_460,&local_468), bVar1) {
                          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x18014c);
                          mir::inst::VarId::VarId
                                    ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                       in_stack_fffffffffffff650),
                                     (VarId *)CONCAT44(in_stack_fffffffffffff64c,
                                                       in_stack_fffffffffffff648));
                          local_480 = std::
                                      map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                      ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                            *)in_stack_fffffffffffff670,
                                           (key_type *)in_stack_fffffffffffff668._M_current);
                          __x = &local_1f0->id;
                          std::
                          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                          local_490 = __gnu_cxx::operator-
                                                ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff654,
                                                             in_stack_fffffffffffff650),
                                                 (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff64c,
                                                             in_stack_fffffffffffff648));
                          std::pair<int,_int>::pair<int_&,_long,_true>(&local_488,__x,&local_490);
                          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                          begin((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                          end((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                          in_stack_fffffffffffff750 =
                               std::
                               find<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>>
                                         (in_stack_fffffffffffff668._M_current,
                                          in_stack_fffffffffffff660,
                                          (pair<int,_int> *)in_stack_fffffffffffff658._M_node);
                          in_stack_fffffffffffffb48 =
                               std::
                               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                               end((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
                          ;
                          bVar1 = __gnu_cxx::operator!=
                                            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff654,
                                                         in_stack_fffffffffffff650),
                                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff64c,
                                                         in_stack_fffffffffffff648));
                          if (bVar1) {
                            __gnu_cxx::
                            __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                            ::__normal_iterator<std::pair<int,int>*>
                                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff654,
                                                   in_stack_fffffffffffff650),
                                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff64c,
                                                   in_stack_fffffffffffff648));
                            in_stack_fffffffffffff748 =
                                 std::
                                 vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ::erase(in_stack_fffffffffffff660._M_current,
                                         in_stack_fffffffffffff668);
                            in_stack_fffffffffffffb38 = in_stack_fffffffffffff748;
                            pmVar10 = std::
                                      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                            *)in_stack_fffffffffffff670,
                                           &(in_stack_fffffffffffff668._M_current)->first);
                            local_4d8 = std::
                                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ::size(&pmVar10->inst);
                            std::pair<int,_int>::pair<int_&,_unsigned_long,_true>
                                      (&local_4d0,&local_244,&local_4d8);
                            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ::push_back((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff654,
                                                    in_stack_fffffffffffff650),
                                        (value_type *)
                                        CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648
                                                ));
                          }
                          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)
                                     CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
                        }
                        std::
                        set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)0x18013a);
                        std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                              *)in_stack_fffffffffffff670,
                             &(in_stack_fffffffffffff668._M_current)->first);
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                    ,(value_type *)
                                     CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650),
                                   in_stack_fffffffffffff64c);
                        local_4f4 = 0xffffffff;
                        std::make_unique<mir::inst::AssignInst,mir::inst::VarId,int>
                                  (in_stack_fffffffffffff6a8,
                                   (int *)CONCAT44(in_stack_fffffffffffff6a4,
                                                   in_stack_fffffffffffff6a0));
                        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                        operator=((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)in_stack_fffffffffffff660._M_current,
                                  (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                   *)in_stack_fffffffffffff658._M_node);
                        std::
                        unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                       *)CONCAT44(in_stack_fffffffffffff654,
                                                  in_stack_fffffffffffff650));
                      }
                      local_620 = mir::inst::VarId::operator_cast_to_unsigned_int(local_410);
                      pmVar7 = std::
                               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                               ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                     *)in_stack_fffffffffffff670,
                                    (key_type_conflict *)in_stack_fffffffffffff668._M_current);
                      pmVar7->is_temp_var = false;
                      local_8d = 1;
                      goto LAB_0017fa0c;
                    }
                  }
                  else {
                    std::get<mir::inst::VarId,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)0x17fc72);
                    mir::inst::VarId::VarId
                              ((VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650
                                                ),
                               (VarId *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648
                                                ));
                    std::get<mir::inst::VarId,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)0x17fca2);
                    mir::inst::VarId::VarId
                              ((VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650
                                                ),
                               (VarId *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648
                                                ));
                    std::
                    __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x17fcce);
                    std::
                    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x17fcda);
                    sVar9 = std::
                            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                     *)in_stack_fffffffffffff660._M_current,
                                    (key_type *)in_stack_fffffffffffff658._M_node);
                    if (sVar9 != 0) {
                      std::
                      __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17fd0f);
                      std::
                      __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x17fd1b);
                      sVar9 = std::
                              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                       *)in_stack_fffffffffffff660._M_current,
                                      (key_type *)in_stack_fffffffffffff658._M_node);
                      if (sVar9 != 0) {
                        std::
                        variant<optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                        ::
                        variant<optimization::global_expr_move::Op&,void,void,optimization::global_expr_move::Op,void>
                                  ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                    *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                   (Op *)CONCAT44(in_stack_fffffffffffff64c,
                                                  in_stack_fffffffffffff648));
                        local_244 = bfs((Global_Expr_Mov *)in_stack_fffffffffffffb48._M_current,
                                        in_stack_fffffffffffffb44,
                                        (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                         *)in_stack_fffffffffffffb38._M_current);
                        goto LAB_0017ff8c;
                      }
                    }
                  }
                }
LAB_00180b0d:
                local_738 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            __gnu_cxx::
                            __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                          *)in_stack_fffffffffffff658._M_node,
                                         in_stack_fffffffffffff654);
                goto LAB_0017fa0c;
              }
              if ((local_22c != 3) || ((*(byte *)(in_RDI + 8) & 1) == 0)) goto LAB_00180b0d;
              if (local_238 == (type)0x0) {
                local_950 = 0;
              }
              else {
                local_950 = __dynamic_cast(local_238,&mir::inst::Inst::typeinfo,
                                           &mir::inst::LoadOffsetInst::typeinfo,0);
              }
              local_628 = local_950;
              in_stack_fffffffffffff6a8 =
                   std::get<mir::inst::VarId,int,mir::inst::VarId>
                             ((variant<int,_mir::inst::VarId> *)0x1808d2);
              std::pair<mir::inst::VarId,_mir::inst::Value>::
              pair<mir::inst::VarId_&,_mir::inst::Value_&,_true>
                        ((pair<mir::inst::VarId,_mir::inst::Value> *)
                         in_stack_fffffffffffff660._M_current,
                         (VarId *)in_stack_fffffffffffff658._M_node,
                         (Value *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
              std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::
              pair<mir::inst::VarId_&,_true>
                        ((pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                         in_stack_fffffffffffff660._M_current,
                         (pair<mir::inst::VarId,_mir::inst::Value> *)
                         in_stack_fffffffffffff658._M_node,
                         (VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
              in_stack_fffffffffffff6a4 = local_1e4;
              std::
              variant<optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
              ::
              variant<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>&,void,void,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>,void>
                        ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                          *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         (pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                         CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              in_stack_fffffffffffff6a0 =
                   bfs((Global_Expr_Mov *)in_stack_fffffffffffffb48._M_current,
                       in_stack_fffffffffffffb44,
                       (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        *)in_stack_fffffffffffffb38._M_current);
              local_69c = in_stack_fffffffffffff6a0;
              if (in_stack_fffffffffffff6a0 == local_1e4) goto LAB_00180b0d;
              std::
              __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x180989);
              std::
              map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
              ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                    *)in_stack_fffffffffffff670,&(in_stack_fffffffffffff668._M_current)->first);
              in_stack_fffffffffffff690 =
                   (Var_Replace *)
                   std::
                   map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                   ::at((map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                         *)in_stack_fffffffffffff670,
                        (key_type *)in_stack_fffffffffffff668._M_current);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         (VarId *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              in_stack_fffffffffffff688 =
                   (MirFunction *)
                   std::
                   map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                         *)in_stack_fffffffffffff670,
                        (key_type_conflict *)in_stack_fffffffffffff668._M_current);
              if (((in_stack_fffffffffffff688->name).field_2._M_local_buf[2] & 1U) != 0)
              goto LAB_00180b0d;
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         0x180a0f);
              in_stack_fffffffffffff678 = (Var_Replace *)local_710;
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         (VarId *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              in_stack_fffffffffffff680 = (Livevar_Analyse *)(local_728 + 8);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         (VarId *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
              var_replace::Var_Replace::replace
                        ((Var_Replace *)in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                         (VarId *)in_stack_fffffffffffff780);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         0x180a68);
              local_72c = 0xfffffc19;
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int>
                        (in_stack_fffffffffffff6a8,
                         (int *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
              in_stack_fffffffffffff660._M_current = (pair<int,_int> *)local_728;
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffff660._M_current,
                         (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                          *)in_stack_fffffffffffff658._M_node);
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
              in_stack_fffffffffffff668._M_current = (pair<int,_int> *)(local_10 + 0x38);
              local_730 = mir::inst::VarId::operator_cast_to_unsigned_int
                                    ((VarId *)(local_710 + 0x10));
              in_stack_fffffffffffff670 =
                   (Op *)std::
                         map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                         ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                               *)in_stack_fffffffffffff670,
                              (key_type_conflict *)in_stack_fffffffffffff668._M_current);
              (in_stack_fffffffffffff670->lhs).field_0x11 = false;
              local_8d = 1;
            } while( true );
          }
        }
        if ((local_8d & 1) == 0) {
          local_768 = 7;
        }
        else {
          local_768 = 0;
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x180c2c);
        std::__cxx11::list<int,_std::allocator<int>_>::~list
                  ((list<int,_std::allocator<int>_> *)0x180c39);
        var_replace::Var_Replace::~Var_Replace
                  ((Var_Replace *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
        livevar_analyse::Livevar_Analyse::~Livevar_Analyse
                  ((Livevar_Analyse *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650))
        ;
        if (local_768 != 0) {
          return;
        }
      } while( true );
    }
    local_40 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x17f56e)
    ;
    local_48 = &local_40->second;
    local_50._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    while( true ) {
      local_58 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      if (!bVar1) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_50);
      pIVar8 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x17f604);
      iVar2 = (*(pIVar8->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 2) {
        local_68 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
        if (local_68 == (type)0x0) {
          local_780 = 0;
        }
        else {
          local_780 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                     &mir::inst::RefInst::typeinfo,0);
        }
        local_70 = local_780;
        if (local_48->id == local_18->id) break;
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x17f6c4);
        pmVar7 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)in_stack_fffffffffffff670,
                      (key_type_conflict *)in_stack_fffffffffffff668._M_current);
        pmVar7->is_temp_var = false;
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                    (value_type *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
        ::__normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                  ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        local_78 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   std::
                   vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)in_stack_fffffffffffff660._M_current,
                           (const_iterator)in_stack_fffffffffffff668._M_current);
        local_50._M_current = local_78;
      }
      else {
        local_88 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                   ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff658._M_node,in_stack_fffffffffffff654);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  } while( true );
LAB_00180b29:
  pVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff670,
                      &(in_stack_fffffffffffff668._M_current)->first);
  in_stack_fffffffffffff658 = pVar12.first._M_node;
  local_740 = pVar12.second;
  in_stack_fffffffffffff654 = CONCAT13(local_740,(int3)in_stack_fffffffffffff654);
  local_750 = &local_1f0->preceding;
  local_748 = in_stack_fffffffffffff658._M_node;
  local_758._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  local_760._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  while (bVar1 = std::operator!=(&local_758,&local_760), bVar1) {
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffff660._M_current,
               (value_type_conflict3 *)in_stack_fffffffffffff658._M_node);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  }
  goto LAB_0017f8b0;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }

    auto& startblk = func.basic_blks.begin()->second;
    for (auto& blkpair : func.basic_blks) {
      auto& blk = blkpair.second;
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        auto& inst = *iter;
        if (inst->inst_kind() == mir::inst::InstKind::Ref) {
          auto& i = *inst;
          auto refinst = dynamic_cast<mir::inst::RefInst*>(&i);
          if (blk.id == startblk.id) {
            break;
          }
          func.variables.at(inst->dest.id).is_temp_var = false;
          startblk.inst.push_back(std::move(inst));
          iter = blk.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
    int cnt = 0;
    while (true) {
      bool modify = false;
      livevar_analyse::Livevar_Analyse lva(func);
      lva.build();
      var_replace::Var_Replace vp(func);
      env = std::make_shared<Env>(func, lva, vp, offset);
      std::list<mir::types::LabelId> queue;
      std::set<mir::types::LabelId> visited;
      auto iter = func.basic_blks.end();
      iter--;
      queue.push_back(iter->first);
      while (!queue.empty()) {
        auto start = queue.front();
        queue.pop_front();
        if (visited.count(start)) {
          continue;
        }

        auto& blk = func.basic_blks.at(start);
        {  // visit logic
          auto& block = blk;
          auto& blv = lva.livevars[start];
          auto& variables = func.variables;
          for (auto iter = block.inst.begin(); iter != block.inst.end();) {
            auto& inst = *iter;
            if (func.variables.at(inst->dest.id).is_phi_var) {
              iter++;
              continue;
            }
            auto kind = inst->inst_kind();
            auto& i = *inst;
            switch (kind) {
              case mir::inst::InstKind::Op: {
                auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
                if (opInst->lhs.is_immediate() && opInst->rhs.is_immediate()) {
                  break;
                }
                int id = -1;
                Op op(opInst->op, opInst->lhs, opInst->rhs);
                if (!opInst->lhs.is_immediate() &&
                    !opInst->rhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(lhs) ||
                      !blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                } else if (!opInst->lhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  if (!blv->live_vars_in->count(lhs)) {
                    break;
                  }
                  id = bfs(start, op);

                } else if (!opInst->rhs.is_immediate()) {
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                }
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).ops.at(op);
                if (func.variables.at(var.id).is_phi_var) {
                  vp.setdefpoint(inst->dest, id,
                                 func.basic_blks.at(id).inst.size());
                  for (auto var : inst->useVars()) {
                    auto& usepoints = vp.usepoints.at(var);
                    std::pair<mir::types::LabelId, int> point = {
                        blk.id, iter - block.inst.begin()};
                    auto find_iter =
                        std::find(usepoints.begin(), usepoints.end(), point);
                    if (find_iter != usepoints.end()) {
                      usepoints.erase(find_iter);
                      usepoints.push_back(
                          {id, func.basic_blks.at(id).inst.size()});
                    }
                  }
                  func.basic_blks.at(id).inst.push_back(std::move(inst));
                  inst = std::make_unique<mir::inst::AssignInst>(
                      mir::inst::VarId(-1), -1);
                } else {
                  LOG(TRACE)
                      << inst->dest << " is replaced to " << var << std::endl;
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                }
                func.variables.at(var).is_temp_var = false;
                modify = true;
                continue;
              }
              case mir::inst::InstKind::Load: {
                if (!offset) {
                  break;
                }
                auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
                LoadOp op = {{std::get<mir::inst::VarId>(loadInst->src),
                              loadInst->offset},
                             loadInst->dest};
                auto id = bfs(start, op);
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).loads.at(op.first);
                if (!func.variables.at(var.id).is_phi_var) {
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                  func.variables.at(var).is_temp_var = false;
                  modify = true;
                  continue;
                } else {
                  break;
                }
              }
              // case mir::inst::InstKind::Store: {
              //   auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);

              //   break;
              // }
              default:;
            }
            iter++;
          }
        }
        visited.insert(start);
        for (auto pre : blk.preceding) {
          queue.push_back(pre);
        }
      }
      if (!modify) {
        break;
      }
    }
  }